

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::
RegisterTests(ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>
              *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *__s;
  pointer pcVar3;
  element_type *peVar4;
  _Alloc_hider _Var5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  long *plVar11;
  uchar *obj_bytes;
  ostream *poVar12;
  size_t sVar13;
  const_iterator cVar14;
  long *plVar15;
  char *pcVar16;
  undefined4 extraout_var;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer pIVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  bool bVar21;
  string param_name;
  string test_suite_name;
  string test_name;
  ParamGenerator<google::protobuf::internal::(anonymous_namespace)::TestParam> generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  pointer local_330;
  string local_318;
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8;
  undefined7 uStack_2e7;
  size_t local_2d8;
  char *local_2d0;
  undefined8 local_2c8;
  char local_2c0;
  undefined7 uStack_2bf;
  long *local_2b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  CodeLocation local_2a0;
  pointer local_278;
  pointer local_270;
  pointer local_268;
  ParamNameGeneratorFunc *local_260;
  char *local_258;
  long *local_250;
  long local_240 [2];
  string local_230;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  CodeLocation local_1e0;
  undefined1 local_1b8 [16];
  _func_Message_ptr_Arena_ptr *local_1a8;
  size_t local_1a0;
  ios_base local_138 [264];
  
  local_2f8 = &local_2e8;
  local_2f0 = 0;
  local_2e8 = 0;
  local_2d0 = &local_2c0;
  local_2c8 = 0;
  local_2c0 = '\0';
  local_330 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_278 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_330 != local_278) {
    bVar7 = false;
    do {
      pIVar17 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_270 = (this->instantiations_).
                  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::InstantiationInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar17 != local_270) {
        do {
          (*pIVar17->generator)(&local_2b0);
          sVar2 = (pIVar17->name)._M_string_length;
          local_260 = pIVar17->name_func;
          __s = pIVar17->file;
          iVar9 = pIVar17->line;
          local_268 = pIVar17;
          if (sVar2 == 0) {
            local_2f0 = 0;
            *local_2f8 = 0;
          }
          else {
            local_1b8._0_8_ = &local_1a8;
            pcVar3 = (pIVar17->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)local_1b8,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)local_1b8);
            std::__cxx11::string::operator=((string *)&local_2f8,(string *)local_1b8);
            if ((_func_Message_ptr_Arena_ptr **)local_1b8._0_8_ != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8 + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_2f8,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_210._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_210._M_impl.super__Rb_tree_header._M_header;
          local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_210._M_impl.super__Rb_tree_header._M_header._M_right =
               local_210._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar10 = (long *)(**(code **)(*local_2b0 + 0x10))();
          plVar11 = (long *)(**(code **)(*local_2b0 + 0x18))();
          if (plVar10 != plVar11) {
            local_2d8 = 0;
            while( true ) {
              cVar6 = (**(code **)(*plVar10 + 0x30))(plVar10,plVar11);
              if (cVar6 != '\0') break;
              obj_bytes = (uchar *)(**(code **)(*plVar10 + 0x28))(plVar10);
              local_2c8 = 0;
              *local_2d0 = '\0';
              local_1a8 = *(_func_Message_ptr_Arena_ptr **)(obj_bytes + 0x10);
              local_1b8._0_8_ = *(undefined8 *)obj_bytes;
              local_1b8._8_8_ = *(undefined8 *)(obj_bytes + 8);
              local_1a0 = local_2d8;
              (*local_260)(&local_318,
                           (TestParamInfo<google::protobuf::internal::(anonymous_namespace)::TestParam>
                            *)local_1b8);
              _Var5._M_p = local_318._M_dataplus._M_p;
              if (local_318._M_string_length == 0) {
                bVar7 = false;
              }
              else {
                lVar20 = local_318._M_string_length - 1;
                lVar18 = 0;
                do {
                  uVar19 = (uint)(byte)_Var5._M_p[lVar18];
                  iVar8 = isalnum(uVar19);
                  bVar7 = iVar8 != 0 || uVar19 == 0x5f;
                  if (iVar8 == 0 && uVar19 != 0x5f) break;
                  bVar21 = lVar20 != lVar18;
                  lVar18 = lVar18 + 1;
                } while (bVar21);
              }
              bVar7 = IsTrue(bVar7);
              if (!bVar7) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_318._M_dataplus._M_p,
                                     local_318._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," line ",6);
                poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar12,anon_var_dwarf_a22956 + 5,0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
                std::ostream::put((char)poVar12);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              cVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_210,&local_318);
              bVar7 = IsTrue((_Rb_tree_header *)cVar14._M_node ==
                             &local_210._M_impl.super__Rb_tree_header);
              if (!bVar7) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_318._M_dataplus._M_p,
                                     local_318._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," line ",6);
                plVar15 = (long *)std::ostream::operator<<(poVar12,iVar9);
                std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
                std::ostream::put((char)plVar15);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              peVar4 = (local_330->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar16 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_2d0,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar16);
              }
              std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_318._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_210,&local_318);
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_230,local_2f8,local_2f8 + local_2f0);
              pcVar16 = local_2d0;
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              PrintBytesInObjectTo(obj_bytes,0x18,(ostream *)&local_1a8);
              std::__cxx11::stringbuf::str();
              local_258 = pcVar16;
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
              plVar15 = local_250;
              peVar4 = (local_330->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_2a0.file._M_dataplus._M_p = (pointer)&local_2a0.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2a0,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              local_2a0.line = (peVar4->code_location).line;
              iVar8 = (*(this->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])();
              bVar7 = IsTrue(true);
              if (!bVar7) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x201);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                           ,0x6a);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19ac9f0);
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,iVar9);
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              bVar7 = IsTrue(true);
              if (!bVar7) {
                GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x216);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                           ,0x6f);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19ac9f0);
                }
                else {
                  sVar13 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,__s,sVar13);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,iVar9);
                GTestLog::~GTestLog((GTestLog *)local_1b8);
              }
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)(((local_330->
                                                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                                                )._M_ptr)->test_meta_factory)._M_t.
                                              super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_>_>
                                              .
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>_*,_false>
                                    + 0x10))();
              MakeAndRegisterTestInfo
                        (&local_230,local_258,(char *)0x0,(char *)plVar15,&local_2a0,
                         (TypeId)CONCAT44(extraout_var,iVar8),(SetUpTestSuiteFunc)0x0,
                         (TearDownTestSuiteFunc)0x0,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0.file._M_dataplus._M_p != &local_2a0.file.field_2) {
                operator_delete(local_2a0.file._M_dataplus._M_p,
                                local_2a0.file.field_2._M_allocated_capacity + 1);
              }
              if (local_250 != local_240) {
                operator_delete(local_250,local_240[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._M_dataplus._M_p != &local_318.field_2) {
                operator_delete(local_318._M_dataplus._M_p,
                                local_318.field_2._M_allocated_capacity + 1);
              }
              local_2d8 = local_2d8 + 1;
              bVar7 = true;
              (**(code **)(*plVar10 + 0x18))(plVar10);
            }
          }
          if (plVar11 != (long *)0x0) {
            (**(code **)(*plVar11 + 8))(plVar11);
          }
          if (plVar10 != (long *)0x0) {
            (**(code **)(*plVar10 + 8))(plVar10);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_210);
          if (local_2a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a8);
          }
          pIVar17 = local_268 + 1;
        } while (pIVar17 != local_270);
      }
      local_330 = local_330 + 1;
    } while (local_330 != local_278);
    if (bVar7) goto LAB_008f9d6b;
  }
  iVar9 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                    (this);
  paVar1 = &local_1e0.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_1e0.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar9),&local_1e0,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.file._M_dataplus._M_p,local_1e0.file.field_2._M_allocated_capacity + 1
                   );
  }
LAB_008f9d6b:
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,CONCAT71(uStack_2bf,local_2c0) + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,CONCAT71(uStack_2e7,local_2e8) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }